

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateFindDependencyCalls(cmExportFileGenerator *this,ostream *os)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  *pmVar3;
  reference ppcVar4;
  cmFindPackageStack *pcVar5;
  string *psVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  cmFindPackageCall *pcVar9;
  iterator iVar10;
  iterator iVar11;
  reference ppVar12;
  ostream *poVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  WrapQuotes in_R8D;
  undefined1 auVar14 [16];
  string_view str;
  string local_1a0;
  reference local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>
  *it;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  *__range1_1;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
  local_121;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
  local_120;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
  local_118;
  undefined1 local_110 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  packageDependenciesSorted;
  mapped_type *dep;
  cmFindPackageCall *fpc;
  cmFindPackageStack pkgStack;
  string local_c8;
  cmValue local_a8;
  cmValue exportFindPackageName;
  string findPackageName;
  cmGeneratorTarget *gt;
  iterator __end1;
  iterator __begin1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range1;
  cmExportSet *exportSet;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  packageDependencies;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  packageDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)os;
  std::operator<<(os,"include(CMakeFindDependencyMacro)\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
         *)&exportSet);
  iVar2 = (*this->_vptr_cmExportFileGenerator[0x13])();
  if ((cmExportSet *)CONCAT44(extraout_var,iVar2) != (cmExportSet *)0x0) {
    pmVar3 = cmExportSet::GetPackageDependencies_abi_cxx11_
                       ((cmExportSet *)CONCAT44(extraout_var,iVar2));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
    ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                 *)&exportSet,pmVar3);
  }
  __end1 = std::
           set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           ::begin(&this->ExternalTargets);
  gt = (cmGeneratorTarget *)
       std::
       set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
       ::end(&this->ExternalTargets);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&gt), bVar1) {
    ppcVar4 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end1);
    this_00 = *ppcVar4;
    std::__cxx11::string::string((string *)&exportFindPackageName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"EXPORT_FIND_PACKAGE_NAME",
               (allocator<char> *)
               ((long)&pkgStack.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    local_a8 = cmGeneratorTarget::GetProperty(this_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pkgStack.super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    pcVar5 = cmTarget::GetFindPackageStack(this_00->Target);
    cmFindPackageStack::cmFindPackageStack((cmFindPackageStack *)&fpc,pcVar5);
    bVar1 = cmValue::IsEmpty(&local_a8);
    if (bVar1) {
      bVar1 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                        ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&fpc);
      if (!bVar1) {
        pcVar9 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                           ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&fpc);
        std::__cxx11::string::operator=((string *)&exportFindPackageName,(string *)pcVar9);
      }
    }
    else {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_a8);
      std::__cxx11::string::operator=((string *)&exportFindPackageName,(string *)psVar6);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                             *)&exportSet,(key_type *)&exportFindPackageName);
      bVar1 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                        ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&fpc);
      if (!bVar1) {
        pcVar9 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                           ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&fpc);
        std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>
                  ((optional<unsigned_int> *)
                   &packageDependenciesSorted.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&pcVar9->Index);
        (pmVar8->FindPackageIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)
             packageDependenciesSorted.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      if (pmVar8->Enabled == Auto) {
        pmVar8->Enabled = On;
      }
    }
    cmFindPackageStack::~cmFindPackageStack((cmFindPackageStack *)&fpc);
    std::__cxx11::string::~string((string *)&exportFindPackageName);
    std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end1);
  }
  local_118._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                *)&exportSet);
  local_120._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
              *)&exportSet);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
  ::allocator(&local_121);
  std::
  vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>
  ::
  vector<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,cmExportSet::PackageDependency>>,void>
            ((vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>
              *)local_110,local_118,local_120,&local_121);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
  ::~allocator(&local_121);
  iVar10 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                    *)local_110);
  iVar11 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
           ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                  *)local_110);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>
            (iVar10._M_current,iVar11._M_current);
  __end1_1 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                      *)local_110);
  it = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                 *)local_110);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>_>
                             *)&it), bVar1) {
    ppVar12 = __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>_>
              ::operator*(&__end1_1);
    if ((ppVar12->second).Enabled == On) {
      poVar13 = std::operator<<((ostream *)
                                packageDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count
                                ,"find_dependency(");
      std::operator<<(poVar13,(string *)ppVar12);
      this_01 = &(ppVar12->second).ExtraArguments;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
      arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&arg), bVar1) {
        local_180 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        poVar13 = std::operator<<((ostream *)
                                  packageDependencies._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count," ");
        auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_180);
        str._M_len = auVar14._8_8_;
        str._M_str = (char *)0x0;
        cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_1a0,auVar14._0_8_,str,in_R8D);
        std::operator<<(poVar13,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::operator<<((ostream *)
                      packageDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,")\n");
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<((ostream *)packageDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\n\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
             *)local_110);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
          *)&exportSet);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream& os)
{
  os << "include(CMakeFindDependencyMacro)\n";
  std::map<std::string, cmExportSet::PackageDependency> packageDependencies;
  auto* exportSet = this->GetExportSet();
  if (exportSet) {
    packageDependencies = exportSet->GetPackageDependencies();
  }

  for (cmGeneratorTarget const* gt : this->ExternalTargets) {
    std::string findPackageName;
    auto exportFindPackageName = gt->GetProperty("EXPORT_FIND_PACKAGE_NAME");
    cmFindPackageStack pkgStack = gt->Target->GetFindPackageStack();
    if (!exportFindPackageName.IsEmpty()) {
      findPackageName = *exportFindPackageName;
    } else {
      if (!pkgStack.Empty()) {
        cmFindPackageCall const& fpc = pkgStack.Top();
        findPackageName = fpc.Name;
      }
    }
    if (!findPackageName.empty()) {
      auto& dep = packageDependencies[findPackageName];
      if (!pkgStack.Empty()) {
        dep.FindPackageIndex = pkgStack.Top().Index;
      }
      if (dep.Enabled == cmExportSet::PackageDependencyExportEnabled::Auto) {
        dep.Enabled = cmExportSet::PackageDependencyExportEnabled::On;
      }
    }
  }

  std::vector<std::pair<std::string, cmExportSet::PackageDependency>>
    packageDependenciesSorted(packageDependencies.begin(),
                              packageDependencies.end());
  std::sort(
    packageDependenciesSorted.begin(), packageDependenciesSorted.end(),
    [](const std::pair<std::string, cmExportSet::PackageDependency>& lhs,
       const std::pair<std::string, cmExportSet::PackageDependency>& rhs)
      -> bool {
      if (lhs.second.SpecifiedIndex) {
        if (rhs.second.SpecifiedIndex) {
          return lhs.second.SpecifiedIndex < rhs.second.SpecifiedIndex;
        }
        assert(rhs.second.FindPackageIndex);
        return true;
      }
      assert(lhs.second.FindPackageIndex);
      if (rhs.second.SpecifiedIndex) {
        return false;
      }
      assert(rhs.second.FindPackageIndex);
      return lhs.second.FindPackageIndex < rhs.second.FindPackageIndex;
    });

  for (auto const& it : packageDependenciesSorted) {
    if (it.second.Enabled == cmExportSet::PackageDependencyExportEnabled::On) {
      os << "find_dependency(" << it.first;
      for (auto const& arg : it.second.ExtraArguments) {
        os << " " << cmOutputConverter::EscapeForCMake(arg);
      }
      os << ")\n";
    }
  }
  os << "\n\n";
}